

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

void ZSTD_buildFSETable_body_default
               (ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,U32 *baseValue,
               U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize)

{
  short sVar1;
  ushort uVar2;
  ZSTD_seqSymbol ZVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  uint tableLog_local;
  U8 *nbAdditionalBits_local;
  U32 *baseValue_local;
  uint maxSymbolValue_local;
  short *normalizedCounter_local;
  ZSTD_seqSymbol *dt_local;
  U32 nextState;
  U32 symbol;
  U32 u_1;
  int n_1;
  int i_1;
  U32 position_1;
  U32 s_3;
  U32 step_1;
  U32 tableMask_1;
  size_t uPosition;
  size_t u;
  size_t unroll;
  size_t s_2;
  size_t position;
  int local_b0;
  int n;
  int i;
  U32 s_1;
  U64 sv;
  size_t pos;
  U64 add;
  size_t step;
  size_t tableMask;
  U32 s;
  S16 largeLimit;
  ZSTD_seqSymbol_header DTableH;
  U32 highThreshold;
  BYTE *spread;
  U16 *symbolNext;
  U32 tableSize;
  U32 maxSV1;
  ZSTD_seqSymbol *tableDecode;
  
  uVar4 = maxSymbolValue + 1;
  bVar9 = (byte)tableLog;
  uVar5 = 1 << (bVar9 & 0x1f);
  DTableH.fastMode = uVar5 - 1;
  if (0x34 < maxSymbolValue) {
    __assert_fail("maxSymbolValue <= MaxSeq",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x1d5,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (9 < tableLog) {
    __assert_fail("tableLog <= MaxFSELog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x1d6,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (wkspSize < 0x272) {
    __assert_fail("wkspSize >= ZSTD_BUILD_FSE_TABLE_WKSP_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x1d7,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  s = 1;
  for (tableMask._4_4_ = 0; tableMask._4_4_ < uVar4; tableMask._4_4_ = tableMask._4_4_ + 1) {
    if (normalizedCounter[tableMask._4_4_] == -1) {
      dt[(ulong)DTableH.fastMode + 1].baseValue = tableMask._4_4_;
      *(undefined2 *)((long)wksp + (ulong)tableMask._4_4_ * 2) = 1;
      DTableH.fastMode = DTableH.fastMode - 1;
    }
    else {
      if ((short)(1 << (bVar9 - 1 & 0x1f)) <= normalizedCounter[tableMask._4_4_]) {
        s = 0;
      }
      if (normalizedCounter[tableMask._4_4_] < 0) {
        __assert_fail("normalizedCounter[s]>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x1e5,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      *(short *)((long)wksp + (ulong)tableMask._4_4_ * 2) = normalizedCounter[tableMask._4_4_];
    }
  }
  ZVar3.baseValue = tableLog;
  ZVar3.nextState = (undefined2)s;
  ZVar3.nbAdditionalBits = s._2_1_;
  ZVar3.nbBits = s._3_1_;
  *dt = ZVar3;
  if (0x200 < uVar5) {
    __assert_fail("tableSize <= 512",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x1ec,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (DTableH.fastMode == uVar5 - 1) {
    uVar8 = (ulong)((uVar5 >> 1) + (uVar5 >> 3) + 3);
    sv = 0;
    _i = 0;
    for (n = 0; (uint)n < uVar4; n = n + 1) {
      iVar6 = (int)normalizedCounter[(uint)n];
      MEM_write64((void *)((long)wksp + sv + 0x6a),_i);
      for (local_b0 = 8; local_b0 < iVar6; local_b0 = local_b0 + 8) {
        MEM_write64((void *)((long)wksp + (long)local_b0 + sv + 0x6a),_i);
      }
      if (iVar6 < 0) {
        __assert_fail("n>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x207,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      sv = (long)iVar6 + sv;
      _i = _i + 0x101010101010101;
    }
    s_2 = 0;
    if ((uVar5 & 1) != 0) {
      __assert_fail("tableSize % unroll == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x215,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
    for (unroll = 0; unroll < uVar5; unroll = unroll + 2) {
      for (uPosition = 0; uPosition < 2; uPosition = uPosition + 1) {
        dt[(s_2 + uPosition * uVar8 & (ulong)(uVar5 - 1)) + 1].baseValue =
             (uint)*(byte *)((long)wksp + unroll + uPosition + 0x6a);
      }
      s_2 = s_2 + uVar8 * 2 & (ulong)(uVar5 - 1);
    }
    if (s_2 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x21e,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  else {
    n_1 = 0;
    for (i_1 = 0; (uint)i_1 < uVar4; i_1 = i_1 + 1) {
      sVar1 = normalizedCounter[(uint)i_1];
      for (u_1 = 0; (int)u_1 < (int)sVar1; u_1 = u_1 + 1) {
        dt[(ulong)(uint)n_1 + 1].baseValue = i_1;
        do {
          n_1 = n_1 + (uVar5 >> 1) + (uVar5 >> 3) + 3 & uVar5 - 1;
        } while (DTableH.fastMode < (uint)n_1);
      }
    }
    if (n_1 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x22c,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  nextState = 0;
  while( true ) {
    if (uVar5 <= nextState) {
      return;
    }
    uVar4 = dt[(ulong)nextState + 1].baseValue;
    uVar2 = *(ushort *)((long)wksp + (ulong)uVar4 * 2);
    *(ushort *)((long)wksp + (ulong)uVar4 * 2) = uVar2 + 1;
    uVar7 = ZSTD_highbit32((uint)uVar2);
    dt[(ulong)nextState + 1].nbBits = bVar9 - (char)uVar7;
    dt[(ulong)nextState + 1].nextState =
         (uVar2 << (dt[(ulong)nextState + 1].nbBits & 0x1f)) - (short)uVar5;
    if (0xfe < nbAdditionalBits[uVar4]) break;
    dt[(ulong)nextState + 1].nbAdditionalBits = nbAdditionalBits[uVar4];
    dt[(ulong)nextState + 1].baseValue = baseValue[uVar4];
    nextState = nextState + 1;
  }
  __assert_fail("nbAdditionalBits[symbol] < 255",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                ,0x237,
                "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
               );
}

Assistant:

static void ZSTD_buildFSETable_body_default(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize)
{
    ZSTD_buildFSETable_body(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}